

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

void __thiscall
happly::TypedListProperty<signed_char>::readNextBigEndian
          (TypedListProperty<signed_char> *this,istream *stream)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  uint uVar4;
  size_t count;
  size_t afterSize;
  unsigned_long local_30;
  pointer local_28;
  
  local_30 = 0;
  std::istream::read((char *)stream,(long)&local_30);
  iVar1 = this->listCountBytes;
  if (iVar1 == 2) {
    local_30 = (unsigned_long)(ushort)((ushort)local_30 << 8 | (ushort)local_30 >> 8);
  }
  else if (iVar1 == 4) {
    uVar4 = anon_unknown_3::swapEndian<unsigned_int>((uint)local_30);
    local_30 = (unsigned_long)uVar4;
  }
  else if (iVar1 == 8) {
    local_30 = anon_unknown_3::swapEndian<unsigned_long>(local_30);
  }
  pcVar2 = (this->flattenedData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = (this->flattenedData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_28 = pcVar2 + (local_30 - (long)pcVar3);
  geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->flattenedData,(size_type)local_28);
  if (local_30 != 0) {
    std::istream::read((char *)stream,
                       (long)(pcVar2 + ((long)(this->flattenedData).
                                              super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)pcVar3)));
  }
  std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->flattenedIndexStart,
             (unsigned_long *)&local_28);
  return;
}

Assistant:

virtual void readNextBigEndian(std::istream& stream) override {

    // Read the size of the list
    size_t count = 0;
    stream.read(((char*)&count), listCountBytes);
    if (listCountBytes == 8) {
      count = (size_t)swapEndian((uint64_t)count);
    } else if (listCountBytes == 4) {
      count = (size_t)swapEndian((uint32_t)count);
    } else if (listCountBytes == 2) {
      count = (size_t)swapEndian((uint16_t)count);
    }

    // Read list elements
    size_t currSize = flattenedData.size();
    size_t afterSize = currSize + count;
    flattenedData.resize(afterSize);
    if (count > 0) {
      stream.read((char*)&flattenedData[currSize], count * sizeof(T));
    }
    flattenedIndexStart.emplace_back(afterSize);

    // Swap endian order of list elements
    for (size_t iFlat = currSize; iFlat < afterSize; iFlat++) {
      flattenedData[iFlat] = swapEndian(flattenedData[iFlat]);
    }
  }